

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

void __thiscall
mjs::native_object::do_debug_print_extra
          (native_object *this,wostream *os,int indent_incr,int max_nest,int indent)

{
  gc_heap *h;
  wostream *pwVar1;
  value local_a8;
  native_object_property *local_80;
  native_object_property *p;
  native_object_property *__end1;
  native_object_property *__begin1;
  gc_vector<mjs::native_object::native_object_property> *__range1;
  allocator<wchar_t> local_49;
  wstring local_48 [8];
  wstring indent_string;
  int indent_local;
  int max_nest_local;
  int indent_incr_local;
  wostream *os_local;
  native_object *this_local;
  
  indent_string.field_2._M_local_buf[3] = indent;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,(long)indent,L' ',&local_49);
  std::allocator<wchar_t>::~allocator(&local_49);
  h = object::heap(&this->super_object);
  __begin1 = (native_object_property *)
             gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
             ::dereference(&this->native_properties_,h);
  __end1 = gc_vector<mjs::native_object::native_object_property>::begin
                     ((gc_vector<mjs::native_object::native_object_property> *)__begin1);
  p = gc_vector<mjs::native_object::native_object_property>::end
                ((gc_vector<mjs::native_object::native_object_property> *)__begin1);
  for (; __end1 != p; __end1 = __end1 + 1) {
    local_80 = __end1;
    pwVar1 = std::operator<<(os,local_48);
    pwVar1 = std::operator<<(pwVar1,local_80->name);
    std::operator<<(pwVar1,": ");
    (*local_80->get)(&local_a8,this);
    debug_print(os,&local_a8,indent_incr,1,indent_string.field_2._M_local_buf[3]);
    value::~value(&local_a8);
    std::operator<<(os,"\n");
  }
  object::do_debug_print_extra
            (&this->super_object,os,indent_incr,max_nest,indent_string.field_2._M_local_buf[3]);
  std::__cxx11::wstring::~wstring(local_48);
  return;
}

Assistant:

void native_object::do_debug_print_extra(std::wostream& os, int indent_incr, int max_nest, int indent) const {
    const auto indent_string = std::wstring(indent, ' ');
    for (const auto& p: native_properties_.dereference(heap())) {
        os << indent_string << p.name << ": ";
        mjs::debug_print(os, p.get(*this), indent_incr, 1, indent);
        os << "\n";
    }
    object::do_debug_print_extra(os, indent_incr, max_nest, indent);
}